

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFBXImporterExporter.cpp
# Opt level: O3

void __thiscall
utFBXImporterExporter_importPhongMaterial_Test::~utFBXImporterExporter_importPhongMaterial_Test
          (utFBXImporterExporter_importPhongMaterial_Test *this)

{
  AbstractImportExportBase::~AbstractImportExportBase((AbstractImportExportBase *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( utFBXImporterExporter, importPhongMaterial ) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/FBX/phong_cube.fbx", aiProcess_ValidateDataStructure );
    EXPECT_NE( nullptr, scene );
    EXPECT_EQ( 1u, scene->mNumMaterials );
    const aiMaterial *mat = scene->mMaterials[0];
    EXPECT_NE( nullptr, mat );
    float f;
    aiColor3D c;

    // phong_cube.fbx has all properties defined
    EXPECT_EQ( mat->Get(AI_MATKEY_COLOR_DIFFUSE, c), aiReturn_SUCCESS );
    EXPECT_EQ( c, aiColor3D(0.5, 0.25, 0.25) );
    EXPECT_EQ( mat->Get(AI_MATKEY_COLOR_SPECULAR, c), aiReturn_SUCCESS );
    EXPECT_EQ( c, aiColor3D(0.25, 0.25, 0.5) );
    EXPECT_EQ( mat->Get(AI_MATKEY_SHININESS_STRENGTH, f), aiReturn_SUCCESS );
    EXPECT_EQ( f, 0.5f );
    EXPECT_EQ( mat->Get(AI_MATKEY_SHININESS, f), aiReturn_SUCCESS );
    EXPECT_EQ( f, 10.0f );
    EXPECT_EQ( mat->Get(AI_MATKEY_COLOR_AMBIENT, c), aiReturn_SUCCESS );
    EXPECT_EQ( c, aiColor3D(0.125, 0.25, 0.25) );
    EXPECT_EQ( mat->Get(AI_MATKEY_COLOR_EMISSIVE, c), aiReturn_SUCCESS );
    EXPECT_EQ( c, aiColor3D(0.25, 0.125, 0.25) );
    EXPECT_EQ( mat->Get(AI_MATKEY_COLOR_TRANSPARENT, c), aiReturn_SUCCESS );
    EXPECT_EQ( c, aiColor3D(0.75, 0.5, 0.25) );
    EXPECT_EQ( mat->Get(AI_MATKEY_OPACITY, f), aiReturn_SUCCESS );
    EXPECT_EQ( f, 0.5f );
}